

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult *
JsonTest::checkEqual<unsigned_int,double>
          (TestResult *result,uint expected,double actual,char *file,uint line,char *expr)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  TestResult *in_RDI;
  char *in_XMM0_Qa;
  char (*in_stack_00000178) [11];
  TestResult *in_stack_00000180;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((double)in_ESI != (double)in_XMM0_Qa) || (NAN((double)in_ESI) || NAN((double)in_XMM0_Qa))) {
    TestResult::addFailure
              ((TestResult *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_XMM0_Qa,
               (uint)((ulong)in_RDX >> 0x20),(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(double *)in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [2])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(double *)in_stack_00000178);
  }
  return in_RDI;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}